

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O2

wchar_t tree_ascend(tree *t)

{
  tree_entry *ptVar1;
  wchar_t fd;
  wchar_t wVar2;
  int *piVar3;
  
  ptVar1 = t->stack;
  wVar2 = t->working_dir_fd;
  if ((ptVar1->flags & 2) == 0) {
    fd = open_on_current_dir(t,"..",L'\x00080000');
    __archive_ensure_cloexec_flag(fd);
  }
  else {
    fd = ptVar1->symlink_parent_fd;
  }
  if (fd < L'\0') {
    piVar3 = __errno_location();
    t->tree_errno = *piVar3;
    wVar2 = L'\xfffffffe';
  }
  else {
    t->working_dir_fd = fd;
    *(byte *)&t->flags = (byte)t->flags & 0xbf;
    close_and_restore_time(wVar2,t,&ptVar1->restore_time);
    if ((ptVar1->flags & 2) != 0) {
      t->openCount = t->openCount + -1;
      ptVar1->symlink_parent_fd = -1;
    }
    t->depth = t->depth + -1;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

static int
tree_ascend(struct tree *t)
{
	struct tree_entry *te;
	int new_fd, r = 0, prev_dir_fd;

	te = t->stack;
	prev_dir_fd = t->working_dir_fd;
	if (te->flags & isDirLink)
		new_fd = te->symlink_parent_fd;
	else {
		new_fd = open_on_current_dir(t, "..", O_RDONLY | O_CLOEXEC);
		__archive_ensure_cloexec_flag(new_fd);
	}
	if (new_fd < 0) {
		t->tree_errno = errno;
		r = TREE_ERROR_FATAL;
	} else {
		/* Renew the current working directory. */
		t->working_dir_fd = new_fd;
		t->flags &= ~onWorkingDir;
		/* Current directory has been changed, we should
		 * close an fd of previous working directory. */
		close_and_restore_time(prev_dir_fd, t, &te->restore_time);
		if (te->flags & isDirLink) {
			t->openCount--;
			te->symlink_parent_fd = -1;
		}
		t->depth--;
	}
	return (r);
}